

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

SharedPluralRules * __thiscall
icu_63::LocaleCacheKey<icu_63::SharedPluralRules>::createObject
          (LocaleCacheKey<icu_63::SharedPluralRules> *this,void *param_1,UErrorCode *status)

{
  PluralRules *pPVar1;
  SharedPluralRules *this_00;
  size_t size;
  Locale LStack_f8;
  
  Locale::Locale(&LStack_f8,(this->fLoc).fullName,(char *)0x0,(char *)0x0,(char *)0x0);
  size = 0;
  pPVar1 = PluralRules::internalForLocale(&LStack_f8,UPLURAL_TYPE_CARDINAL,status);
  if ((pPVar1 == (PluralRules *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  Locale::~Locale(&LStack_f8);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = (SharedPluralRules *)UMemory::operator_new((UMemory *)0x20,size);
    if (this_00 == (SharedPluralRules *)0x0) {
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    else {
      (this_00->super_SharedObject).softRefCount = 0;
      (this_00->super_SharedObject).hardRefCount = (__atomic_base<int>)0x0;
      (this_00->super_SharedObject).cachePtr = (UnifiedCacheBase *)0x0;
      (this_00->super_SharedObject).super_UObject._vptr_UObject =
           (_func_int **)&PTR__SharedPluralRules_003a9b80;
      this_00->ptr = pPVar1;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        SharedObject::addRef((SharedObject *)this_00);
        return this_00;
      }
      (*(this_00->super_SharedObject).super_UObject._vptr_UObject[1])(this_00);
    }
  }
  if (pPVar1 != (PluralRules *)0x0) {
    (*(pPVar1->super_UObject)._vptr_UObject[1])(pPVar1);
  }
  return (SharedPluralRules *)0x0;
}

Assistant:

U_I18N_API
const SharedPluralRules *LocaleCacheKey<SharedPluralRules>::createObject(
        const void * /*unused*/, UErrorCode &status) const {
    const char *localeId = fLoc.getName();
    LocalPointer<PluralRules> pr(PluralRules::internalForLocale(localeId, UPLURAL_TYPE_CARDINAL, status), status);
    if (U_FAILURE(status)) {
        return nullptr;
    }
    LocalPointer<SharedPluralRules> result(new SharedPluralRules(pr.getAlias()), status);
    if (U_FAILURE(status)) {
        return nullptr;
    }
    pr.orphan(); // result was successfully created so it nows pr.
    result->addRef();
    return result.orphan();
}